

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builder.cpp
# Opt level: O2

Error __thiscall asmjit::v1_14::BaseBuilder::addPass(BaseBuilder *this,Pass *pass)

{
  Error EVar1;
  Pass *pass_local;
  
  if ((this->super_BaseEmitter)._code == (CodeHolder *)0x0) {
    EVar1 = 5;
  }
  else if (pass == (Pass *)0x0) {
    EVar1 = 1;
  }
  else if (pass->_cb == (BaseBuilder *)0x0) {
    pass_local = pass;
    EVar1 = ZoneVector<asmjit::v1_14::Pass_*>::append(&this->_passes,&this->_allocator,&pass_local);
    if (EVar1 == 0) {
      pass_local->_cb = this;
      EVar1 = 0;
    }
  }
  else {
    EVar1 = (uint)(pass->_cb != this) * 3;
  }
  return EVar1;
}

Assistant:

ASMJIT_FAVOR_SIZE Error BaseBuilder::addPass(Pass* pass) noexcept {
  if (ASMJIT_UNLIKELY(!_code))
    return DebugUtils::errored(kErrorNotInitialized);

  if (ASMJIT_UNLIKELY(pass == nullptr)) {
    // Since this is directly called by `addPassT()` we treat `null` argument
    // as out-of-memory condition. Otherwise it would be API misuse.
    return DebugUtils::errored(kErrorOutOfMemory);
  }
  else if (ASMJIT_UNLIKELY(pass->_cb)) {
    // Kinda weird, but okay...
    if (pass->_cb == this)
      return kErrorOk;
    return DebugUtils::errored(kErrorInvalidState);
  }

  ASMJIT_PROPAGATE(_passes.append(&_allocator, pass));
  pass->_cb = this;
  return kErrorOk;
}